

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_remove(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint uVar1;
  char *__filename;
  int *piVar2;
  int64_t iVar3;
  JSValueUnion JVar4;
  JSValue JVar5;
  
  JVar4.float64 = 0.0;
  __filename = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  if (__filename == (char *)0x0) {
    iVar3 = 6;
  }
  else {
    uVar1 = remove(__filename);
    if (uVar1 == 0xffffffff) {
      piVar2 = __errno_location();
      uVar1 = -*piVar2;
    }
    JS_FreeCString(ctx,__filename);
    JVar4._4_4_ = 0;
    JVar4.int32 = uVar1;
    iVar3 = 0;
  }
  JVar5.tag = iVar3;
  JVar5.u.float64 = JVar4.float64;
  return JVar5;
}

Assistant:

static JSValue js_os_remove(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    const char *filename;
    int ret;
    
    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        return JS_EXCEPTION;
#if defined(_WIN32)
    {
        struct stat st;
        if (stat(filename, &st) == 0 && S_ISDIR(st.st_mode)) {
            ret = rmdir(filename);
        } else {
            ret = unlink(filename);
        }
    }
#else
    ret = remove(filename);
#endif
    ret = js_get_errno(ret);
    JS_FreeCString(ctx, filename);
    return JS_NewInt32(ctx, ret);
}